

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.hpp
# Opt level: O2

string * format_error<char_const*&>
                   (string *__return_storage_ptr__,Options *options,char *type,
                   optional<const_TokenStream::TextStream_&> *stream,char *filename,uint32_t lineno,
                   uint32_t colno,uint32_t length,char *msg,char **args)

{
  char **arg0;
  unreachable_exception *this;
  optional<const_TokenStream::TextStream_&> *poVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6;
  uint32_t lineno_local;
  allocator<char> local_152;
  allocator<char> local_151;
  string local_150;
  anon_class_32_4_eb191f4b make_helper;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  string_view local_40;
  
  arg0 = args;
  make_helper.lineno = &lineno_local;
  make_helper.colno = &colno;
  lineno_local = lineno;
  make_helper.stream = stream;
  make_helper.length = &length;
  if (options->error_format == JSON) {
    poVar1 = stream;
    if (filename == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"null",&local_151);
    }
    else {
      make_helper.lineno = &lineno_local;
      local_40.__data = filename;
      local_40.__size = strlen(filename);
      make_quoted_abi_cxx11_(&local_150,&local_40,'\"');
    }
    if (type == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"null",&local_152);
    }
    else {
      local_50.__data = type;
      local_50.__size = strlen(type);
      make_quoted_abi_cxx11_(&local_d0,&local_50,'\"');
    }
    fmt::format<char_const*>(&local_b0,(fmt *)msg,(CStringRef)args,(char **)poVar1);
    local_60.__data = local_b0._M_dataplus._M_p;
    local_60.__size = local_b0._M_string_length;
    make_quoted_abi_cxx11_(&local_90,&local_60,'\"');
    bVar3 = stream->ref != (TextStream *)0x0;
    bVar4 = lineno_local != 0;
    if (bVar4 && bVar3) {
      format_error<char_const*&>(Options_const&,char_const*,std::experimental::optional<TokenStream::TextStream_const&>,char_const*,unsigned_int,unsigned_int,unsigned_int,char_const*,char_const*&)
      ::{lambda()#1}::operator()[abi_cxx11_(&local_110,&make_helper);
      local_70.__data = local_110._M_dataplus._M_p;
      local_70.__size = local_110._M_string_length;
      args_6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x198efd;
      make_quoted_abi_cxx11_(&local_f0,&local_70,'\"');
    }
    else {
      args_6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x198ecf;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"null",(allocator<char> *)&local_110);
    }
    fmt::
    format<std::__cxx11::string,std::__cxx11::string,unsigned_int,unsigned_int,unsigned_int,std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,
               (fmt *)
               "{{\"file\": {}, \"type\": {}, \"line\": {}, \"column\": {}, \"length\": {}, \"message\": {}, \"helper\": {}}}"
               ,(CStringRef)&local_150,&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lineno_local,
               &colno,&length,(uint *)&local_90,&local_f0,args_6);
    std::__cxx11::string::~string((string *)&local_f0);
    if (bVar4 && bVar3) {
      std::__cxx11::string::~string((string *)&local_110);
    }
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_150);
  }
  else {
    if (options->error_format != Default) {
      make_helper.lineno = &lineno_local;
      this = (unreachable_exception *)__cxa_allocate_exception(0x10);
      unreachable_exception::unreachable_exception
                (this,
                 "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/program.hpp(418)."
                );
      __cxa_throw(this,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    poVar1 = stream;
    make_helper.lineno = &lineno_local;
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    cVar2 = (char)__return_storage_ptr__;
    if (filename == (char *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::push_back(cVar2);
    }
    if (lineno_local != 0) {
      std::__cxx11::to_string(&local_150,lineno_local);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::push_back(cVar2);
      poVar1 = (optional<const_TokenStream::TextStream_&> *)
               CONCAT71((int7)((ulong)poVar1 >> 8),colno != 0 && lineno_local != 0);
      if (colno != 0 && lineno_local != 0) {
        std::__cxx11::to_string(&local_150,colno);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::push_back(cVar2);
      }
    }
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::push_back(cVar2);
    }
    if (type != (char *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    fmt::format<char_const*>(&local_150,(fmt *)msg,(CStringRef)arg0,(char **)poVar1);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_150);
    if ((stream->ref != (TextStream *)0x0) && (lineno_local != 0)) {
      std::__cxx11::string::push_back(cVar2);
      format_error<char_const*&>(Options_const&,char_const*,std::experimental::optional<TokenStream::TextStream_const&>,char_const*,unsigned_int,unsigned_int,unsigned_int,char_const*,char_const*&)
      ::{lambda()#1}::operator()[abi_cxx11_(&local_150,&make_helper);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_150);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string format_error(const Options& options,
                                const char* type,
                                optional<const TokenStream::TextStream&> stream,
                                const char* filename, uint32_t lineno, uint32_t colno, uint32_t length,
                                const char* msg, Args&&... args)
{
    auto make_helper = [&]() -> std::string
    {
        Expects(stream && lineno && colno);

        std::string arrow_line;
        std::string line = stream->get_line(lineno);
        arrow_line.reserve(colno + length);

        for(size_t i = 0; i < colno; ++i)
            arrow_line.push_back(line[i] != '\t'? ' ' : '\t');
        arrow_line.back() = '^';

        for(size_t i = 1; i < length; ++i)
            arrow_line.push_back('~');

        return fmt::format(" {}\n {}", line, arrow_line);
    };

    if(options.error_format == Options::ErrorFormat::Default)
    {
        std::string message;
        message.reserve(255);

        if(filename)
        {
            message += filename;
            message.push_back(':');
        }
        else
        {
            message += "gta3sc:";
        }

        if(lineno)
        {
            message += std::to_string(lineno);
            message.push_back(':');
        }

        if(lineno && colno)
        {
            message += std::to_string(colno);
            message.push_back(':');
        }

        if(message.size())
        {
            message.push_back(' ');
        }

        if(type)
        {
            message += type;
            message += ": ";
        }

        message += fmt::format(msg, std::forward<Args>(args)...);

        if(stream && lineno)
        {
            message.push_back('\n');
            message += make_helper();
        }

        return message;
    }
    else if(options.error_format == Options::ErrorFormat::JSON)
    {
        /*
            This is the JSON object to be printed (in a single line!):
            {
                "file": string | null,
                "type": string | null, // "error", "warning", "note" or "fatal error"
                "line": integer,        // 0 means no line information
                "column": integer,      // 0 means no column information
                "length": integer,      // 0 means no length information
                "message": string,
                "helper": string | null,
            }
        */
        return fmt::format(R"({{"file": {}, "type": {}, "line": {}, "column": {}, "length": {}, "message": {}, "helper": {}}})",
                            filename? make_quoted(filename) : "null",
                            type? make_quoted(type) : "null",
                            lineno, colno, length,  // line, column, length
                            make_quoted(fmt::format(msg, std::forward<Args>(args)...)),
                            stream && lineno? make_quoted(make_helper()) : "null");

    }
    else
    {
        Unreachable();
    }
}